

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanLogicalDevice::FreeDescriptorSet
          (VulkanLogicalDevice *this,VkDescriptorPool Pool,VkDescriptorSet Set)

{
  undefined8 in_RCX;
  string msg;
  VkDescriptorSet local_40;
  string local_38;
  
  local_40 = Set;
  if (Pool == (VkDescriptorPool)0x0 || Set == (VkDescriptorSet)0x0) {
    Diligent::FormatString<char[26],char[48]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Pool != VK_NULL_HANDLE && Set != VK_NULL_HANDLE",
               (char (*) [48])CONCAT71((int7)((ulong)in_RCX >> 8),Set != (VkDescriptorSet)0x0));
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"FreeDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x232);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  (*vkFreeDescriptorSets)(this->m_VkDevice,Pool,1,&local_40);
  return;
}

Assistant:

void VulkanLogicalDevice::FreeDescriptorSet(VkDescriptorPool Pool, VkDescriptorSet Set) const
{
    VERIFY_EXPR(Pool != VK_NULL_HANDLE && Set != VK_NULL_HANDLE);
    vkFreeDescriptorSets(m_VkDevice, Pool, 1, &Set);
}